

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

void __thiscall Sudoku::collectSolutionHints(Sudoku *this,string *filename)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  FieldVector testFields;
  double local_80;
  vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> local_78;
  double local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"collect solution hints",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  local_78.super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  createFieldCopy(this,&local_78);
  if (local_78.super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      bVar2 = Field::fixed(*(Field **)
                            ((long)&((local_78.
                                      super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                            lVar8));
      if (!bVar2) {
        Field::resetTriedValues
                  (*(Field **)
                    ((long)&((local_78.
                              super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar8));
      }
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar6 < (ulong)((long)local_78.
                                   super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_78.
                                   super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + filename->_M_string_length);
  (*this->_vptr_Sudoku[2])(this,1,&local_78,1,local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"average number of possibilities from ",0x25);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," runs: ",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  plVar7 = (this->nPossibilities_).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  plVar5 = (this->nPossibilities_).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (plVar7 == plVar5) {
    local_80 = 0.0;
    plVar5 = plVar7;
  }
  else {
    lVar8 = this->nRuns_;
    local_80 = 0.0;
    do {
      local_58 = (double)*plVar7;
      dVar9 = round(local_58 / (double)lVar8);
      poVar4 = std::ostream::_M_insert<double>(dVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      lVar8 = this->nRuns_;
      local_80 = local_80 + local_58 / (double)lVar8;
      plVar7 = plVar7 + 1;
    } while (plVar7 != plVar5);
    plVar7 = (this->nPossibilities_).super__Vector_base<long_long,_std::allocator<long_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    plVar5 = (this->nPossibilities_).super__Vector_base<long_long,_std::allocator<long_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," total average: ",0x10);
  lVar8 = (long)plVar5 - (long)plVar7 >> 3;
  auVar10._8_4_ = (int)((long)plVar5 - (long)plVar7 >> 0x23);
  auVar10._0_8_ = lVar8;
  auVar10._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (local_80 /
                      ((auVar10._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," nfixed: ",9);
  iVar3 = nFixed(this);
  plVar5 = (long *)std::ostream::operator<<(poVar4,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::~vector(&local_78);
  return;
}

Assistant:

void Sudoku::collectSolutionHints(std::string filename)
{
  //std::cout<<"Press Enter . . . "<<std::endl;
  //std::cin.get();
  std::cout<<"collect solution hints"<<std::endl;

  FieldVector testFields;   // testFields is created as copy of fields_ the first time fixSomeFieldsToGetASolvableSudoku is called

  createFieldCopy(testFields);

  const int numberRuns = 1;
  for(int n = 0; n < numberRuns; n++)
  {
    // clear tried values
    for(int i = 0; i < testFields.size(); i++)
    {
      if(!testFields[i]->fixed())
        testFields[i]->resetTriedValues();
    }

    bool createSolutionHints = (n == numberRuns-1);
    fixSomeFieldsToGetASolvableSudoku(createSolutionHints, testFields, true, filename);
  }

  int i=0;
  std::cout<<"average number of possibilities from "<<numberRuns<<" runs: "<<std::endl;
  double average = 0.0;
  for(long long value : nPossibilities_)
  {
    std::cout<<round((double)value/nRuns_)<<" ";
    average += (double)value/nRuns_;
    i++;
  }
  average /= nPossibilities_.size();

  std::cout<<std::endl<<" total average: "<<average<<std::endl
    <<" nfixed: "<<nFixed()<<std::endl;
}